

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall CaDiCaL::Proof::delete_unit_clause(Proof *this,uint64_t id,int lit)

{
  add_literal(this,lit);
  this->clause_id = id;
  this->redundant = false;
  delete_clause(this);
  return;
}

Assistant:

void Proof::delete_unit_clause (uint64_t id, const int lit) {
  LOG ("PROOF deleting unit from proof %d", lit);
  assert (clause.empty ());
  add_literal (lit);
  clause_id = id;
  redundant = false;
  delete_clause ();
}